

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_fmr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  uintptr_t o;
  
  if (ctx->fpu_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12b28);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
    if ((ctx->opcode & 1) != 0) {
      gen_set_cr1_from_fpscr((DisasContext_conflict10 *)ctx->uc->tcg_ctx);
    }
    tcg_temp_free_internal_ppc64(s,ts);
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_fmr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i64 t0;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t0, rB(ctx->opcode));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    if (unlikely(Rc(ctx->opcode))) {
        gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
}